

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<std::chrono::duration<long,std::ratio<1l,1000000l>>>
               (duration<long,_std::ratio<1L,_1000000L>_> *value,ostream *os)

{
  ostream *os_local;
  duration<long,_std::ratio<1L,_1000000L>_> *value_local;
  
  RawBytesPrinter::PrintValue<std::chrono::duration<long,std::ratio<1l,1000000l>>,8ul>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}